

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

_Bool intersect_segment_triangle(vec3 p,vec3 q,vec3 a,vec3 b,vec3 c,float *t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar5 = a.z;
  fVar2 = a.x;
  fVar6 = b.x - fVar2;
  fVar1 = a.y;
  fVar7 = b.y - fVar1;
  fVar8 = b.z - fVar5;
  fVar14 = c.x - fVar2;
  fVar15 = c.y - fVar1;
  fVar10 = c.z - fVar5;
  fVar11 = p.x - q.x;
  fVar12 = p.y - q.y;
  fVar13 = p.z - q.z;
  fVar16 = fVar7 * fVar10 - fVar8 * fVar15;
  fVar9 = fVar8 * fVar14 - fVar10 * fVar6;
  fVar3 = fVar6 * fVar15 - fVar14 * fVar7;
  fVar4 = fVar13 * fVar3 + fVar11 * fVar16 + fVar12 * fVar9;
  if (0.0 < fVar4) {
    fVar2 = p.x - fVar2;
    fVar1 = p.y - fVar1;
    fVar5 = p.z - fVar5;
    fVar3 = fVar3 * fVar5 + fVar16 * fVar2 + fVar9 * fVar1;
    *t = fVar3;
    if (0.0 <= fVar3) {
      fVar9 = fVar12 * fVar5 - fVar13 * fVar1;
      fVar5 = fVar13 * fVar2 - fVar5 * fVar11;
      fVar2 = fVar11 * fVar1 - fVar2 * fVar12;
      fVar1 = fVar10 * fVar2 + fVar14 * fVar9 + fVar15 * fVar5;
      if ((((0.0 <= fVar1) && (fVar1 <= fVar4)) &&
          (fVar2 = fVar8 * fVar2 + fVar6 * fVar9 + fVar7 * fVar5, fVar2 <= 0.0)) &&
         (fVar1 - fVar2 <= fVar4)) {
        *t = fVar3 * (1.0 / fVar4);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool intersect_segment_triangle(vec3 p, vec3 q, vec3 a, vec3 b, vec3 c, float *t) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 qp = vec3_subtract(p, q);

    vec3 n = vec3_cross(ab, ac);

    float d = vec3_dot(qp, n);
    if (d <= 0.0f) return false;

    vec3 ap = vec3_subtract(p, a);
    *t = vec3_dot(ap, n);
    if (*t < 0.0f) return false;
    //if (*t > d) return false;

    vec3 e = vec3_cross(qp, ap);
    float v = vec3_dot(ac, e);
    if (v < 0.0f || v > d) return false;
    float w = -vec3_dot(ab, e);
    if (w < 0.0f || v + w > d) return false;

    float ood = 1.0f / d;
    *t *= ood;
    return true;
}